

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O2

int ya_getopt_internal(int argc,char **argv,char *optstring,option *longopts,int *longindex,
                      int long_only)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  int long_only_flag;
  
  if (ya_optopt == 0x3f) {
    ya_optopt = 0;
  }
  if (posixly_correct == -1) {
    check_gnu_extension(optstring);
  }
  if (ya_optind == 0) {
    check_gnu_extension(optstring);
    ya_optind = 1;
    ya_optnext = (char *)0x0;
  }
  pcVar11 = ya_optnext;
  if ((*optstring == '-') || (*optstring == '+')) {
    optstring = optstring + 1;
  }
  if (ya_getopt_internal::start == 0 || ya_optnext != (char *)0x0) {
    uVar4 = (ulong)(uint)ya_optind;
  }
  else {
    uVar8 = (ya_optind + ya_getopt_internal::start) - ya_getopt_internal::end;
    uVar4 = 1;
    if (1 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    lVar7 = (long)ya_optind;
    lVar9 = (long)ya_getopt_internal::end;
    ya_optind = (int)uVar4;
    while( true ) {
      ya_getopt_internal::end = ya_getopt_internal::end - 1;
      lVar6 = lVar9 + -1;
      if (lVar9 <= ya_getopt_internal::start) break;
      lVar9 = (ulong)(uint)ya_getopt_internal::end << 0x20;
      lVar7 = lVar7 + -1;
      pcVar5 = argv[lVar6];
      for (lVar10 = (long)(int)lVar6; lVar10 < lVar7; lVar10 = lVar10 + 1) {
        argv[lVar10] = argv[lVar10 + 1];
        lVar9 = lVar9 + 0x100000000;
      }
      *(char **)((long)argv + (lVar9 >> 0x1d)) = pcVar5;
      lVar9 = lVar6;
    }
    ya_getopt_internal::start = 0;
    ya_getopt_internal::end = (int)lVar6;
  }
  iVar2 = (int)uVar4;
  if (argc <= iVar2) {
    ya_optarg = (char *)0x0;
    return -1;
  }
  if (pcVar11 != (char *)0x0) goto LAB_00103859;
  pcVar11 = argv[iVar2];
  if ((*pcVar11 == '-') && (pcVar11[1] != '\0')) {
LAB_001038f0:
    if ((pcVar11[1] == '-') && (pcVar11[2] == '\0')) {
      ya_optind = (int)uVar4 + 1;
      return -1;
    }
  }
  else {
    if (handle_nonopt_argv == '\x01') {
      ya_optind = iVar2 + 1;
      ya_optarg = pcVar11;
      ya_getopt_internal::start = 0;
      return 1;
    }
    if (posixly_correct != 0) {
      ya_optarg = (char *)0x0;
      return -1;
    }
    uVar4 = (long)iVar2;
    do {
      uVar4 = uVar4 + 1;
      iVar3 = (int)uVar4;
      iVar1 = ya_getopt_internal::end;
      if ((long)argc <= (long)uVar4) break;
    } while ((*argv[uVar4] != '-') || (iVar1 = iVar3, argv[uVar4][1] == '\0'));
    ya_getopt_internal::end = iVar1;
    if (iVar3 == argc) {
      ya_optarg = (char *)0x0;
      ya_getopt_internal::start = iVar2;
      return -1;
    }
    pcVar11 = argv[iVar3];
    ya_optind = iVar3;
    ya_getopt_internal::start = iVar2;
    if (*pcVar11 == '-') goto LAB_001038f0;
  }
  if ((longopts != (option *)0x0) && (pcVar11[1] == '-')) {
    iVar2 = ya_getopt_longopts(argc,argv,pcVar11 + 2,optstring,longopts,longindex,(int *)0x0);
    return iVar2;
  }
  pcVar11 = argv[(int)uVar4] + 1;
  ya_optnext = pcVar11;
LAB_00103859:
  if (long_only != 0) {
    long_only_flag = 0;
    iVar2 = ya_getopt_longopts(argc,argv,pcVar11,optstring,longopts,longindex,&long_only_flag);
    pcVar11 = ya_optnext;
    if (long_only_flag == 0) {
      ya_optnext = (char *)0x0;
      return iVar2;
    }
  }
  uVar8 = (uint)*pcVar11;
  pcVar5 = strchr(optstring,uVar8);
  if (pcVar5 == (char *)0x0) {
    ya_optarg = (char *)0x0;
    if (long_only != 0) {
      ya_getopt_error(optstring,"%s: unrecognized option \'-%s\'\n",*argv,pcVar11);
      ya_optind = ya_optind + 1;
      ya_optnext = (char *)0x0;
      return 0x3f;
    }
    ya_optopt = uVar8;
    ya_getopt_error(optstring,"%s: invalid option -- \'%c\'\n",*argv,(ulong)uVar8);
    uVar8 = 0x3f;
    if (ya_optnext[1] != '\0') {
      ya_optnext = ya_optnext + 1;
      return 0x3f;
    }
  }
  else {
    if (pcVar5[1] != ':') {
      if (pcVar11[1] != '\0') {
        ya_optarg = (char *)0x0;
        ya_optnext = pcVar11 + 1;
        return uVar8;
      }
      ya_optind = ya_optind + 1;
      ya_optarg = (char *)0x0;
      ya_optnext = (char *)0x0;
      return uVar8;
    }
    if (pcVar11[1] == '\0') {
      lVar9 = (long)ya_optind;
      ya_optnext = (char *)0x0;
      iVar2 = ya_optind + 1;
      if (pcVar5[2] == ':') {
        ya_optind = iVar2;
        ya_optarg = (char *)0x0;
        ya_optnext = (char *)0x0;
        return uVar8;
      }
      if (iVar2 == argc) {
        ya_optarg = (char *)0x0;
        ya_optind = iVar2;
        ya_optopt = uVar8;
        ya_getopt_error(optstring,"%s: option requires an argument -- \'%c\'\n",*argv,(ulong)uVar8);
        return (uint)(*optstring != ':') * 5 + 0x3a;
      }
      ya_optind = ya_optind + 2;
      ya_optarg = argv[lVar9 + 1];
      ya_optnext = (char *)0x0;
      return uVar8;
    }
    ya_optarg = pcVar11 + 1;
  }
  ya_optind = ya_optind + 1;
  ya_optnext = (char *)0x0;
  return uVar8;
}

Assistant:

static int ya_getopt_internal(int argc, char * const argv[], const char *optstring, const struct option *longopts, int *longindex, int long_only)
{
    static int start, end;

    if (ya_optopt == '?') {
        ya_optopt = 0;
    }

    if (posixly_correct == -1) {
        check_gnu_extension(optstring);
    }

    if (ya_optind == 0) {
        check_gnu_extension(optstring);
        ya_optind = 1;
        ya_optnext = NULL;
    }

    switch (optstring[0]) {
    case '+':
    case '-':
        optstring++;
    }

    if (ya_optnext == NULL && start != 0) {
        int last_pos = ya_optind - 1;

        ya_optind -= end - start;
        if (ya_optind <= 0) {
            ya_optind = 1;
        }
        while (start < end--) {
            int i;
            char *arg = argv[end];

            for (i = end; i < last_pos; i++) {
                ((char **)argv)[i] = argv[i + 1];
            }
            ((char const **)argv)[i] = arg;
            last_pos--;
        }
        start = 0;
    }

    if (ya_optind >= argc) {
        ya_optarg = NULL;
        return -1;
    }
    if (ya_optnext == NULL) {
        const char *arg = argv[ya_optind];
        if (!is_option(arg)) {
            if (handle_nonopt_argv) {
                ya_optarg = argv[ya_optind++];
                start = 0;
                return 1;
            } else if (posixly_correct) {
                ya_optarg = NULL;
                return -1;
            } else {
                int i;

                start = ya_optind;
                for (i = ya_optind + 1; i < argc; i++) {
                    if (is_option(argv[i])) {
                        end = i;
                        break;
                    }
                }
                if (i == argc) {
                    ya_optarg = NULL;
                    return -1;
                }
                ya_optind = i;
                arg = argv[ya_optind];
            }
        }
        if (strcmp(arg, "--") == 0) {
            ya_optind++;
            return -1;
        }
        if (longopts != NULL && arg[1] == '-') {
            return ya_getopt_longopts(argc, argv, argv[ya_optind] + 2, optstring, longopts, longindex, NULL);
        }
    }

    if (ya_optnext == NULL) {
        ya_optnext = argv[ya_optind] + 1;
    }
    if (long_only) {
        int long_only_flag = 0;
        int rv = ya_getopt_longopts(argc, argv, ya_optnext, optstring, longopts, longindex, &long_only_flag);
        if (!long_only_flag) {
            ya_optnext = NULL;
            return rv;
        }
    }

    return ya_getopt_shortopts(argc, argv, optstring, long_only);
}